

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall
pbrt::StatsAccumulator::AccumulatePixelStats(StatsAccumulator *this,PixelStatsAccumulator *accum)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  Point2i p;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i p_03;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  WrapMode2D wrapMode_03;
  WrapMode2D wrapMode_04;
  WrapMode2D wrapMode_05;
  WrapMode2D wrapMode_06;
  WrapMode2D wrapMode_07;
  WrapMode2D wrapMode_08;
  WrapMode2D wrapMode_09;
  Point2i p_04;
  Point2i p_05;
  Point2i p_06;
  Point2i p_07;
  Point2i p_08;
  Point2i p_09;
  Point2i p_10;
  Point2i p_11;
  Point2i p_12;
  Point2i p_13;
  Point2i p_14;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_01;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  reference pvVar6;
  ColorEncodingHandle *pCVar7;
  Point2i PVar8;
  long *in_RSI;
  long *in_RDI;
  Float FVar9;
  int x_2;
  int y_2;
  Image *accumImage_1;
  Image *threadImage_1;
  size_t i_1;
  int x_1;
  int y_1;
  Image *accumImage;
  Image *threadImage;
  size_t i;
  int x;
  int y;
  Point2i vb_1;
  Point2i va_1;
  Point2i vb;
  Point2i va;
  Point2i res;
  Image *in_stack_fffffffffffff6e8;
  int iVar10;
  Image *in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  WrapMode in_stack_fffffffffffff6fc;
  WrapMode2D *in_stack_fffffffffffff700;
  size_type in_stack_fffffffffffff708;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> *in_stack_fffffffffffff710;
  reference in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  Float in_stack_fffffffffffff72c;
  reference in_stack_fffffffffffff730;
  char (*in_stack_fffffffffffff738) [31];
  char (*in_stack_fffffffffffff740) [30];
  char *in_stack_fffffffffffff748;
  int in_stack_fffffffffffff754;
  char *in_stack_fffffffffffff758;
  reference in_stack_fffffffffffff760;
  reference in_stack_fffffffffffff768;
  int in_stack_fffffffffffff770;
  Float in_stack_fffffffffffff774;
  WrapMode in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  int in_stack_fffffffffffff780;
  int iVar11;
  undefined4 in_stack_fffffffffffff784;
  Point2<int> *in_stack_fffffffffffff788;
  string *local_840;
  ColorEncodingHandle *in_stack_fffffffffffff800;
  ColorEncodingHandle *encoding;
  reference in_stack_fffffffffffff808;
  reference in_stack_fffffffffffff810;
  Allocator in_stack_fffffffffffff818;
  undefined4 in_stack_fffffffffffff820;
  Float in_stack_fffffffffffff824;
  int in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff830;
  string *local_798;
  string *local_6e0;
  int local_630;
  int local_628;
  int iStack_620;
  int local_61c;
  Image *local_618;
  allocator<char> local_603;
  allocator<char> local_602;
  allocator<char> local_601;
  string *local_600;
  string local_5f8 [32];
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [32];
  string *local_598;
  undefined8 local_590;
  Tuple2<pbrt::Point2,_int> local_578;
  Point2<int> local_458;
  Tuple2<pbrt::Point2,_int> local_450;
  reference local_448;
  Point2<int> local_440;
  Tuple2<pbrt::Point2,_int> local_438;
  reference local_430;
  ColorEncodingHandle *local_428;
  Tuple2<pbrt::Point2,_int> local_3f8;
  int local_3f0;
  Tuple2<pbrt::Point2,_int> local_3ec;
  int local_3e4;
  Image *local_3e0;
  undefined1 local_3ca;
  allocator<char> local_3c9;
  string *local_3c8;
  string local_3c0 [32];
  string *local_3a0;
  undefined8 local_398;
  Tuple2<pbrt::Point2,_int> local_380;
  Point2<int> local_260;
  Tuple2<pbrt::Point2,_int> local_258;
  reference local_250;
  Point2<int> local_248;
  Tuple2<pbrt::Point2,_int> local_240;
  reference local_238;
  ulong local_230;
  Tuple2<pbrt::Point2,_int> local_200;
  int local_1f8;
  Tuple2<pbrt::Point2,_int> local_1f4;
  int local_1ec;
  Tuple2<pbrt::Point2,_int> local_1e8;
  Tuple2<pbrt::Point2,_int> local_1e0;
  Tuple2<pbrt::Point2,_int> local_1d8;
  Tuple2<pbrt::Point2,_int> local_1d0;
  Image *local_1c8;
  undefined1 local_1b5;
  allocator<char> local_1a1;
  string *local_1a0;
  string local_198 [32];
  string *local_178;
  undefined8 local_170;
  Tuple2<pbrt::Point2,_int> local_158;
  Point2<int> local_38;
  Tuple2<pbrt::Point2,_int> local_30;
  Tuple2<pbrt::Vector2,_int> local_28;
  Tuple2<pbrt::Point2,_int> local_20;
  long *local_18;
  
  local_18 = in_RSI;
  local_28 = (Tuple2<pbrt::Vector2,_int>)
             Bounds2<int>::Diagonal((Bounds2<int> *)in_stack_fffffffffffff6e8);
  Point2<int>::Point2<int>
            ((Point2<int> *)in_stack_fffffffffffff6f0,(Vector2<int> *)in_stack_fffffffffffff6e8);
  local_30 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(*in_RDI + 0x150));
  Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                      (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),(int)in_stack_fffffffffffff6e8
                     );
  bVar1 = Tuple2<pbrt::Point2,_int>::operator==(&local_30,&local_38);
  if (bVar1) {
    local_158 = local_20;
    local_1b5 = 1;
    local_1a0 = local_198;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff730,
               (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               (allocator<char> *)in_stack_fffffffffffff720);
    local_1b5 = 0;
    local_178 = local_198;
    local_170 = 1;
    v._M_array._4_4_ = in_stack_fffffffffffff6fc;
    v._M_array._0_4_ = in_stack_fffffffffffff6f8;
    v._M_len = (size_type)in_stack_fffffffffffff700;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff6f0,v);
    ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff6f0);
    channels.ptr._4_4_ = in_stack_fffffffffffff824;
    channels.ptr._0_4_ = in_stack_fffffffffffff820;
    channels.n._0_4_ = in_stack_fffffffffffff828;
    channels.n._4_4_ = in_stack_fffffffffffff82c;
    Image::Image(in_stack_fffffffffffff810,(PixelFormat)((ulong)in_stack_fffffffffffff808 >> 0x20),
                 (Point2i)in_stack_fffffffffffff830,channels,in_stack_fffffffffffff800,
                 in_stack_fffffffffffff818);
    Image::operator=(in_stack_fffffffffffff6f0,local_1c8);
    Image::~Image(in_stack_fffffffffffff6f0);
    local_6e0 = (string *)&local_178;
    in_stack_fffffffffffff6e8 = local_1c8;
    do {
      local_6e0 = local_6e0 + -0x20;
      std::__cxx11::string::~string(local_6e0);
    } while (local_6e0 != local_198);
    std::allocator<char>::~allocator(&local_1a1);
  }
  else {
    local_1d0 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(*in_RDI + 0x150));
    local_1d8 = local_20;
    bVar1 = Tuple2<pbrt::Point2,_int>::operator==(&local_1d0,(Point2<int> *)&local_1d8);
    if (!bVar1) {
      LogFatal<char_const(&)[30],char_const(&)[4],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[4],pbrt::Point2<int>&>
                ((LogLevel)((ulong)in_stack_fffffffffffff760 >> 0x20),in_stack_fffffffffffff758,
                 in_stack_fffffffffffff754,in_stack_fffffffffffff748,in_stack_fffffffffffff740,
                 (char (*) [4])in_stack_fffffffffffff738,
                 (char (*) [30])CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                 (Point2<int> *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                 (char (*) [4])CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                 in_stack_fffffffffffff788);
    }
  }
  local_1e0 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(*in_RDI + 0x150));
  local_1e8 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)*local_18);
  bVar1 = Tuple2<pbrt::Point2,_int>::operator==(&local_1e0,(Point2<int> *)&local_1e8);
  if (bVar1) {
    local_1ec = 0;
    while( true ) {
      iVar11 = local_1ec;
      local_1f4 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(*in_RDI + 0x150));
      if (local_1f4.y <= iVar11) break;
      local_1f8 = 0;
      while( true ) {
        iVar11 = local_1f8;
        local_200 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(*in_RDI + 0x150));
        if (local_200.x <= iVar11) break;
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                            (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                            (int)in_stack_fffffffffffff6e8);
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                            (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                            (int)in_stack_fffffffffffff6e8);
        WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
        p_04.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff780;
        p_04.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
        wrapMode.wrap.values[1] = in_stack_fffffffffffff778;
        wrapMode.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
        Image::GetChannel(in_stack_fffffffffffff768,p_04,
                          (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode);
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                            (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                            (int)in_stack_fffffffffffff6e8);
        WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
        p_05.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff780;
        p_05.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
        wrapMode_00.wrap.values[1] = in_stack_fffffffffffff778;
        wrapMode_00.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
        Image::GetChannel(in_stack_fffffffffffff768,p_05,
                          (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_00);
        p.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff774;
        p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff770;
        Image::SetChannel(in_stack_fffffffffffff768,p,
                          (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                          SUB84(in_stack_fffffffffffff760,0));
        local_1f8 = local_1f8 + 1;
      }
      local_1ec = local_1ec + 1;
    }
    sVar2 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                      ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x280));
    sVar3 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                      ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*local_18 + 0x130));
    if (sVar2 < sVar3) {
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*local_18 + 0x130));
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(*local_18 + 0x118));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    }
    sVar2 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                      ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*in_RDI + 0x2b0));
    sVar3 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                      ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*local_18 + 0x160));
    if (sVar2 < sVar3) {
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*local_18 + 0x160));
      std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::resize
                (in_stack_fffffffffffff710,in_stack_fffffffffffff708);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(*local_18 + 0x148));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    }
    for (local_230 = 0; uVar4 = local_230,
        sVar2 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                          ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)(*local_18 + 0x130))
        , uVar4 < sVar2; local_230 = local_230 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(*in_RDI + 0x268),local_230);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(*local_18 + 0x118),local_230);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(*in_RDI + 0x268),local_230);
        std::__cxx11::string::operator=((string *)pvVar6,(string *)pvVar5);
      }
      local_238 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                            ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)
                             (*local_18 + 0x130),local_230);
      local_240 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_238);
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                          (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                          (int)in_stack_fffffffffffff6e8);
      bVar1 = Tuple2<pbrt::Point2,_int>::operator==(&local_240,&local_248);
      if (!bVar1) {
        local_250 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                              ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)
                               (*in_RDI + 0x280),local_230);
        local_258 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_250);
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                            (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                            (int)in_stack_fffffffffffff6e8);
        bVar1 = Tuple2<pbrt::Point2,_int>::operator==(&local_258,&local_260);
        if (bVar1) {
          local_380 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_238);
          local_3ca = 1;
          local_3c8 = local_3c0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff730,
                     (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                     (allocator<char> *)in_stack_fffffffffffff720);
          local_3ca = 0;
          local_3a0 = local_3c0;
          local_398 = 1;
          v_00._M_array._4_4_ = in_stack_fffffffffffff6fc;
          v_00._M_array._0_4_ = in_stack_fffffffffffff6f8;
          v_00._M_len = (size_type)in_stack_fffffffffffff700;
          pstd::
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff6f0,v_00);
          ColorEncodingHandle::TaggedPointer
                    ((ColorEncodingHandle *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
          pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                    ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff6f0);
          channels_00.ptr._4_4_ = in_stack_fffffffffffff824;
          channels_00.ptr._0_4_ = in_stack_fffffffffffff820;
          channels_00.n._0_4_ = in_stack_fffffffffffff828;
          channels_00.n._4_4_ = in_stack_fffffffffffff82c;
          in_stack_fffffffffffff6e8 = local_3e0;
          Image::Image(in_stack_fffffffffffff810,
                       (PixelFormat)((ulong)in_stack_fffffffffffff808 >> 0x20),
                       (Point2i)in_stack_fffffffffffff830,channels_00,in_stack_fffffffffffff800,
                       in_stack_fffffffffffff818);
          Image::operator=(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
          Image::~Image(in_stack_fffffffffffff6f0);
          local_798 = (string *)&local_3a0;
          do {
            local_798 = local_798 + -0x20;
            std::__cxx11::string::~string(local_798);
          } while (local_798 != local_3c0);
          std::allocator<char>::~allocator(&local_3c9);
        }
        local_3e4 = 0;
        while( true ) {
          in_stack_fffffffffffff82c = local_3e4;
          local_3ec = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_238);
          if (local_3ec.y <= in_stack_fffffffffffff82c) break;
          local_3f0 = 0;
          while( true ) {
            in_stack_fffffffffffff828 = local_3f0;
            local_3f8 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_238);
            if (local_3f8.x <= in_stack_fffffffffffff828) break;
            in_stack_fffffffffffff818.memoryResource = (memory_resource *)local_250;
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            in_stack_fffffffffffff808 = local_250;
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
            p_06.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff780;
            p_06.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
            wrapMode_01.wrap.values[1] = in_stack_fffffffffffff778;
            wrapMode_01.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
            in_stack_fffffffffffff824 =
                 Image::GetChannel(in_stack_fffffffffffff768,p_06,
                                   (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_01);
            in_stack_fffffffffffff810 = local_238;
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
            p_07.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff780;
            p_07.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
            wrapMode_02.wrap.values[1] = in_stack_fffffffffffff778;
            wrapMode_02.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
            Image::GetChannel(in_stack_fffffffffffff768,p_07,
                              (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_02);
            p_00.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff774;
            p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff770;
            Image::SetChannel(in_stack_fffffffffffff768,p_00,
                              (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                              SUB84(in_stack_fffffffffffff760,0));
            local_3f0 = local_3f0 + 1;
          }
          local_3e4 = local_3e4 + 1;
        }
      }
    }
    local_428 = (ColorEncodingHandle *)0x0;
    while (encoding = local_428,
          pCVar7 = (ColorEncodingHandle *)
                   std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::size
                             ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)
                              (*local_18 + 0x160)), encoding < pCVar7) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(*in_RDI + 0x298),(size_type)local_428);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(*local_18 + 0x148),(size_type)local_428);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(*in_RDI + 0x298),(size_type)local_428);
        std::__cxx11::string::operator=((string *)pvVar6,(string *)pvVar5);
      }
      local_430 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                            ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)
                             (*local_18 + 0x160),(size_type)local_428);
      local_438 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_430);
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                          (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                          (int)in_stack_fffffffffffff6e8);
      bVar1 = Tuple2<pbrt::Point2,_int>::operator==(&local_438,&local_440);
      if (!bVar1) {
        local_448 = std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::operator[]
                              ((vector<pbrt::Image,_std::allocator<pbrt::Image>_> *)
                               (*in_RDI + 0x2b0),(size_type)local_428);
        local_450 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_448);
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                            (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                            (int)in_stack_fffffffffffff6e8);
        bVar1 = Tuple2<pbrt::Point2,_int>::operator==(&local_450,&local_458);
        if (bVar1) {
          local_578 = (Tuple2<pbrt::Point2,_int>)Image::Resolution(local_430);
          local_600 = local_5f8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff730,
                     (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                     (allocator<char> *)in_stack_fffffffffffff720);
          local_600 = (string *)local_5d8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff730,
                     (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                     (allocator<char> *)in_stack_fffffffffffff720);
          local_600 = (string *)local_5b8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff730,
                     (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                     (allocator<char> *)in_stack_fffffffffffff720);
          local_598 = local_5f8;
          local_590 = 3;
          v_01._M_array._4_4_ = in_stack_fffffffffffff6fc;
          v_01._M_array._0_4_ = in_stack_fffffffffffff6f8;
          v_01._M_len = (size_type)in_stack_fffffffffffff700;
          pstd::
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff6f0,v_01);
          ColorEncodingHandle::TaggedPointer
                    ((ColorEncodingHandle *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
          pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                    ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff6f0);
          channels_01.ptr._4_4_ = in_stack_fffffffffffff824;
          channels_01.ptr._0_4_ = in_stack_fffffffffffff820;
          channels_01.n._0_4_ = in_stack_fffffffffffff828;
          channels_01.n._4_4_ = in_stack_fffffffffffff82c;
          in_stack_fffffffffffff6e8 = local_618;
          Image::Image(in_stack_fffffffffffff810,
                       (PixelFormat)((ulong)in_stack_fffffffffffff808 >> 0x20),
                       (Point2i)in_stack_fffffffffffff830,channels_01,encoding,
                       in_stack_fffffffffffff818);
          Image::operator=(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
          Image::~Image(in_stack_fffffffffffff6f0);
          local_840 = (string *)&local_598;
          do {
            local_840 = local_840 + -0x20;
            std::__cxx11::string::~string(local_840);
          } while (local_840 != local_5f8);
          std::allocator<char>::~allocator(&local_603);
          std::allocator<char>::~allocator(&local_602);
          std::allocator<char>::~allocator(&local_601);
        }
        local_61c = 0;
        while( true ) {
          iVar11 = local_61c;
          PVar8 = Image::Resolution(local_430);
          iStack_620 = PVar8.super_Tuple2<pbrt::Point2,_int>.y;
          if (iStack_620 <= iVar11) break;
          local_628 = 0;
          while( true ) {
            iVar11 = local_628;
            PVar8 = Image::Resolution(local_430);
            local_630 = PVar8.super_Tuple2<pbrt::Point2,_int>.x;
            if (local_630 <= iVar11) break;
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
            p_08.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
            p_08.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
            wrapMode_03.wrap.values[1] = in_stack_fffffffffffff778;
            wrapMode_03.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
            Image::GetChannel(in_stack_fffffffffffff768,p_08,
                              (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_03);
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
            p_09.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
            p_09.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
            wrapMode_04.wrap.values[1] = in_stack_fffffffffffff778;
            wrapMode_04.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
            Image::GetChannel(in_stack_fffffffffffff768,p_09,
                              (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_04);
            PVar8.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff774;
            PVar8.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff770;
            Image::SetChannel(in_stack_fffffffffffff768,PVar8,
                              (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                              SUB84(in_stack_fffffffffffff760,0));
            iVar10 = (int)((ulong)in_stack_fffffffffffff760 >> 0x20);
            in_stack_fffffffffffff768 = local_448;
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
            p_10.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
            p_10.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
            wrapMode_05.wrap.values[1] = in_stack_fffffffffffff778;
            wrapMode_05.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
            in_stack_fffffffffffff774 =
                 Image::GetChannel(in_stack_fffffffffffff768,p_10,iVar10,wrapMode_05);
            in_stack_fffffffffffff760 = local_430;
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
            p_11.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
            p_11.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
            wrapMode_06.wrap.values[1] = in_stack_fffffffffffff778;
            wrapMode_06.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
            Image::GetChannel(in_stack_fffffffffffff768,p_11,
                              (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_06);
            p_01.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff774;
            p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff770;
            Image::SetChannel(in_stack_fffffffffffff768,p_01,
                              (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                              SUB84(in_stack_fffffffffffff760,0));
            in_stack_fffffffffffff778 = (WrapMode)local_448;
            in_stack_fffffffffffff77c = (int)((ulong)local_448 >> 0x20);
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                (int)in_stack_fffffffffffff6e8);
            WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
            p_12.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
            p_12.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
            wrapMode_07.wrap.values[1] = in_stack_fffffffffffff778;
            wrapMode_07.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
            FVar9 = Image::GetChannel(in_stack_fffffffffffff768,p_12,
                                      (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_07);
            iVar10 = (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
            if ((FVar9 != 0.0) || (NAN(FVar9))) {
              in_stack_fffffffffffff720 = local_448;
              Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,iVar10,
                                  (int)in_stack_fffffffffffff6e8);
              Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                  (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                  (int)in_stack_fffffffffffff6e8);
              WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
              p_13.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
              p_13.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
              wrapMode_08.wrap.values[1] = in_stack_fffffffffffff778;
              wrapMode_08.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
              in_stack_fffffffffffff72c =
                   Image::GetChannel(in_stack_fffffffffffff768,p_13,
                                     (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_08);
              Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,
                                  (int)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                                  (int)in_stack_fffffffffffff6e8);
              WrapMode2D::WrapMode2D(in_stack_fffffffffffff700,in_stack_fffffffffffff6fc);
              p_14.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
              p_14.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff77c;
              wrapMode_09.wrap.values[1] = in_stack_fffffffffffff778;
              wrapMode_09.wrap.values[0] = (WrapMode)in_stack_fffffffffffff774;
              Image::GetChannel(in_stack_fffffffffffff768,p_14,
                                (int)((ulong)in_stack_fffffffffffff760 >> 0x20),wrapMode_09);
              p_03.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff774;
              p_03.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff770;
              Image::SetChannel(in_stack_fffffffffffff768,p_03,
                                (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                                SUB84(in_stack_fffffffffffff760,0));
            }
            else {
              in_stack_fffffffffffff730 = local_448;
              Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffff6f0,iVar10,
                                  (int)in_stack_fffffffffffff6e8);
              p_02.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffff774;
              p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff770;
              Image::SetChannel(in_stack_fffffffffffff768,p_02,
                                (int)((ulong)in_stack_fffffffffffff760 >> 0x20),
                                SUB84(in_stack_fffffffffffff760,0));
            }
            local_628 = local_628 + 1;
          }
          local_61c = local_61c + 1;
        }
      }
      local_428 = (ColorEncodingHandle *)
                  ((long)&(local_428->
                          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                          ).bits + 1);
    }
    return;
  }
  LogFatal<char_const(&)[30],char_const(&)[31],char_const(&)[30],pbrt::Point2<int>&,char_const(&)[31],pbrt::Point2<int>&>
            ((LogLevel)((ulong)in_stack_fffffffffffff760 >> 0x20),in_stack_fffffffffffff758,
             in_stack_fffffffffffff754,in_stack_fffffffffffff748,in_stack_fffffffffffff740,
             in_stack_fffffffffffff738,
             (char (*) [30])CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (char (*) [31])CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             in_stack_fffffffffffff788);
}

Assistant:

void StatsAccumulator::AccumulatePixelStats(const PixelStatsAccumulator &accum) {
    Point2i res = Point2i(imageBounds.Diagonal());
    if (stats->pixelTime.Resolution() == Point2i(0, 0))
        stats->pixelTime = Image(PixelFormat::Float, res, {"ms"});
    else
        CHECK_EQ(stats->pixelTime.Resolution(), res);
    CHECK_EQ(stats->pixelTime.Resolution(), accum.stats->time.Resolution());

    for (int y = 0; y < stats->pixelTime.Resolution().y; ++y)
        for (int x = 0; x < stats->pixelTime.Resolution().x; ++x)
            stats->pixelTime.SetChannel({x, y}, 0,
                                        (stats->pixelTime.GetChannel({x, y}, 0) +
                                         accum.stats->time.GetChannel({x, y}, 0)));

    if (stats->pixelCounterImages.size() < accum.stats->counterImages.size()) {
        stats->pixelCounterImages.resize(accum.stats->counterImages.size());
        stats->pixelCounterNames.resize(accum.stats->counterNames.size());
    }
    if (stats->pixelRatioImages.size() < accum.stats->ratioImages.size()) {
        stats->pixelRatioImages.resize(accum.stats->ratioImages.size());
        stats->pixelRatioNames.resize(accum.stats->ratioNames.size());
    }

    for (size_t i = 0; i < accum.stats->counterImages.size(); ++i) {
        if (stats->pixelCounterNames[i].empty())
            stats->pixelCounterNames[i] = accum.stats->counterNames[i];

        const Image &threadImage = accum.stats->counterImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelCounterImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(), {"count"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x)
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
    }
    for (size_t i = 0; i < accum.stats->ratioImages.size(); ++i) {
        if (stats->pixelRatioNames[i].empty())
            stats->pixelRatioNames[i] = accum.stats->ratioNames[i];

        const Image &threadImage = accum.stats->ratioImages[i];
        if (threadImage.Resolution() == Point2i(0, 0))
            continue;
        Image &accumImage = stats->pixelRatioImages[i];
        if (accumImage.Resolution() == Point2i(0, 0))
            accumImage = Image(PixelFormat::Float, threadImage.Resolution(),
                               {"numerator", "denominator", "ratio"});
        for (int y = 0; y < threadImage.Resolution().y; ++y)
            for (int x = 0; x < threadImage.Resolution().x; ++x) {
                accumImage.SetChannel({x, y}, 0,
                                      (accumImage.GetChannel({x, y}, 0) +
                                       threadImage.GetChannel({x, y}, 0)));
                accumImage.SetChannel({x, y}, 1,
                                      (accumImage.GetChannel({x, y}, 1) +
                                       threadImage.GetChannel({x, y}, 1)));
                if (accumImage.GetChannel({x, y}, 0) == 0)
                    accumImage.SetChannel({x, y}, 2, 0.f);
                else
                    accumImage.SetChannel({x, y}, 2,
                                          (accumImage.GetChannel({x, y}, 0) /
                                           accumImage.GetChannel({x, y}, 1)));
            }
    }
}